

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O2

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::readFastq(kstream<gzFile_s_*,_FunctorZlib> *this,kseq *seq)

{
  int iVar1;
  ostream *poVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uStack_20;
  
  (seq->comment)._M_string_length = 0;
  *(seq->comment)._M_dataplus._M_p = '\0';
  (seq->seq)._M_string_length = 0;
  *(seq->seq)._M_dataplus._M_p = '\0';
  (seq->qual)._M_string_length = 0;
  *(seq->qual)._M_dataplus._M_p = '\0';
  if (this->c == 10) {
    iVar1 = getName(this,seq);
    if (iVar1 == -1) {
      if (this->is_eof == 1) {
        uStack_20 = 0xfffffffffffffffe;
        goto LAB_001dcbb7;
      }
      pcVar3 = "ERROR: Unexpected ID after ";
    }
    else if (this->c == 10) {
      __stream = (FILE *)seq;
      getSeq(this,seq);
      if (this->c != 0x2b) {
        uStack_20 = (ulong)(uint)(seq->seq)._M_string_length;
        goto LAB_001dcbb7;
      }
      do {
        iVar1 = getc(this,__stream);
        this->c = iVar1;
        if (iVar1 == 10) {
          getQual(this,seq);
          if (this->c == 10) {
            uStack_20 = (seq->seq)._M_string_length;
            if (uStack_20 == (seq->qual)._M_string_length) goto LAB_001dcbb7;
            pcVar3 = "ERROR: The length of the sequence doesn\'t match the quality for ID ";
          }
          else {
            pcVar3 = "ERROR: The quality string appears to be longer for ID ";
          }
          goto LAB_001dcb9c;
        }
      } while (iVar1 != -1);
      pcVar3 = "ERROR: File ended unexpectedly on ID ";
    }
    else {
      pcVar3 = "ERROR: There must have been a problem reading the ID of ";
    }
  }
  else {
    pcVar3 = "ERROR: Unexpected record start, last valid record: ";
  }
LAB_001dcb9c:
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)seq);
  std::endl<char,std::char_traits<char>>(poVar2);
  uStack_20 = 0xfffffffffffffffd;
LAB_001dcbb7:
  return (int)uStack_20;
}

Assistant:

int readFastq(kseq& seq) {
        seq.comment.clear();
        seq.seq.clear();
        seq.qual.clear();

        if (c != '\n') {
            std::cerr << "ERROR: Unexpected record start, last valid record: " << seq.name << std::endl;
            return -3;
        }

        if (getName(seq) == -1) {
            if (is_eof != 1) {
                std::cerr << "ERROR: Unexpected ID after " << seq.name << std::endl;
                return -3;
            } else {
                return -2;
            }
        }

        bool good(false);
        switch(c){
            case 10:    // new line character
                good = true;
                break;
        }
        if (!good) {
            std::cerr << "ERROR: There must have been a problem reading the ID of " << seq.name << std::endl;
            return -3;
        }

        getSeq(seq);
        if (c != '+') {
            return (int)seq.seq.length();
        }
        while ((c = this->getc()) != -1 && c != '\n');  // Ignore whatever comes after '+'

        if (c == -1) {
            std::cerr << "ERROR: File ended unexpectedly on ID " << seq.name << std::endl;
            return -3; // File ended unexpectedly
        }

        getQual(seq);
        if (c != '\n') {
            std::cerr << "ERROR: The quality string appears to be longer for ID " << seq.name << std::endl;
            return -3;
        }
        if (seq.seq.length() != seq.qual.length()) {
            std::cerr << "ERROR: The length of the sequence doesn't match the quality for ID " << seq.name << std::endl;
            return -3;
        }
        return (int)seq.seq.length();
    }